

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_utctm.cc
# Opt level: O0

int ASN1_UTCTIME_set_string(ASN1_UTCTIME *s,char *str)

{
  int iVar1;
  undefined1 local_38 [8];
  CBS cbs;
  size_t len;
  char *str_local;
  ASN1_UTCTIME *s_local;
  
  cbs.len = strlen(str);
  CBS_init((CBS *)local_38,(uint8_t *)str,cbs.len);
  iVar1 = CBS_parse_utc_time((CBS *)local_38,(tm *)0x0,0);
  if (iVar1 == 0) {
    s_local._4_4_ = 0;
  }
  else {
    if (s != (ASN1_UTCTIME *)0x0) {
      iVar1 = ASN1_STRING_set((ASN1_STRING *)s,str,cbs.len);
      if (iVar1 == 0) {
        return 0;
      }
      s->type = 0x17;
    }
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

int ASN1_UTCTIME_set_string(ASN1_UTCTIME *s, const char *str) {
  // Although elsewhere we allow timezone offsets with UTCTime, to be compatible
  // with some existing misissued certificates, this function is used to
  // construct new certificates and can be stricter.
  size_t len = strlen(str);
  CBS cbs;
  CBS_init(&cbs, (const uint8_t *)str, len);
  if (!CBS_parse_utc_time(&cbs, /*out_tm=*/NULL,
                          /*allow_timezone_offset=*/0)) {
    return 0;
  }
  if (s != NULL) {
    if (!ASN1_STRING_set(s, str, len)) {
      return 0;
    }
    s->type = V_ASN1_UTCTIME;
  }
  return 1;
}